

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_cipher_init_param(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc,int paramNID,int mode)

{
  int iVar1;
  ossl_gost_cipher_ctx *c;
  void *pvVar2;
  void *__src;
  
  c = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  pvVar2 = EVP_CIPHER_CTX_get_app_data((EVP_CIPHER_CTX *)ctx);
  if (pvVar2 == (void *)0x0) {
    iVar1 = gost_cipher_set_param(c,0);
    if (iVar1 == 0) {
      return 0;
    }
    pvVar2 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    EVP_CIPHER_CTX_set_app_data((EVP_CIPHER_CTX *)ctx,pvVar2);
  }
  if (key != (uchar *)0x0) {
    gost_key(&c->cctx,key);
  }
  if (iv != (uchar *)0x0) {
    pvVar2 = (void *)EVP_CIPHER_CTX_original_iv(ctx);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    memcpy(pvVar2,iv,(long)iVar1);
  }
  pvVar2 = (void *)EVP_CIPHER_CTX_iv_noconst(ctx);
  __src = (void *)EVP_CIPHER_CTX_original_iv(ctx);
  iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
  memcpy(pvVar2,__src,(long)iVar1);
  return 1;
}

Assistant:

static int gost_cipher_init_param(EVP_CIPHER_CTX *ctx,
                                  const unsigned char *key,
                                  const unsigned char *iv, int enc,
                                  int paramNID, int mode)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    if (EVP_CIPHER_CTX_get_app_data(ctx) == NULL) {
        if (!gost_cipher_set_param(c, paramNID))
            return 0;
        EVP_CIPHER_CTX_set_app_data(ctx, EVP_CIPHER_CTX_get_cipher_data(ctx));
    }
    if (key)
        gost_key(&(c->cctx), key);
    if (iv) {
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv,
               EVP_CIPHER_CTX_iv_length(ctx));
    }
    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx),
           EVP_CIPHER_CTX_original_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx));
    return 1;
}